

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O3

char * cmdarg(errcxdef *ec,char ***argpp,int *ip,int argc,int ofs,_func_void_errcxdef_ptr *usagefn)

{
  char **ppcVar1;
  char *pcVar2;
  
  if ((**argpp)[(long)ofs + 1] == '\0') {
    *ip = *ip + 1;
    ppcVar1 = *argpp;
    *argpp = ppcVar1 + 1;
    if ((*ip < argc) && (pcVar2 = ppcVar1[1], pcVar2 != (char *)0x0)) {
      if (usagefn == (_func_void_errcxdef_ptr *)0x0) {
        return pcVar2;
      }
      if (*pcVar2 != '\0') {
        return pcVar2;
      }
    }
    else {
      pcVar2 = (char *)0x0;
      if (usagefn == (_func_void_errcxdef_ptr *)0x0) {
        return (char *)0x0;
      }
    }
    (*usagefn)(ec);
  }
  else {
    pcVar2 = **argpp + (long)ofs + 1;
  }
  return pcVar2;
}

Assistant:

char *cmdarg(errcxdef *ec, char ***argpp, int *ip, int argc, int ofs,
             void (*usagefn)(errcxdef *))
{
    char *ret;

    /* 
     *   check to see if the argument is appended directly to the option;
     *   if not, look at the next string 
     */
    ret = (**argpp) + ofs + 1;
    if (*ret == '\0')
    {
        /* 
         *   it's not part of this string - get the argument from the next
         *   string in the vector 
         */
        ++(*ip);
        ++(*argpp);
        ret = (*ip >= argc ? 0 : **argpp);
    }

    /* 
     *   if we didn't find the argument, it's an error - display usage if
     *   we have a valid usage callback
     */
    if ((ret == 0 || *ret == 0) && usagefn != 0)
        (*usagefn)(ec);

    return ret;
}